

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_package.c
# Opt level: O0

int lj_cf_package_searchpath(lua_State *L)

{
  lua_State *L_00;
  size_t *len;
  lua_State *L_01;
  char *pcVar1;
  lua_State *in_RDI;
  char *f;
  char *in_stack_00001fe8;
  char *in_stack_00001ff0;
  char *in_stack_00001ff8;
  char *in_stack_00002000;
  lua_State *in_stack_00002008;
  size_t *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  lua_State *in_stack_ffffffffffffffe8;
  int iVar2;
  undefined4 local_4;
  
  L_00 = (lua_State *)
         luaL_checklstring(in_stack_ffffffffffffffe8,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20)
                           ,in_stack_ffffffffffffffd8);
  len = (size_t *)
        luaL_checklstring(in_stack_ffffffffffffffe8,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                          in_stack_ffffffffffffffd8);
  iVar2 = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  L_01 = (lua_State *)luaL_optlstring(in_RDI,iVar2,in_stack_ffffffffffffffe0,len);
  luaL_optlstring(in_RDI,iVar2,(char *)L_01,len);
  iVar2 = (int)((ulong)len >> 0x20);
  pcVar1 = searchpath(in_stack_00002008,in_stack_00002000,in_stack_00001ff8,in_stack_00001ff0,
                      in_stack_00001fe8);
  if (pcVar1 == (char *)0x0) {
    lua_pushnil(L_00);
    lua_insert(L_01,iVar2);
    local_4 = 2;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int lj_cf_package_searchpath(lua_State *L)
{
  const char *f = searchpath(L, luaL_checkstring(L, 1),
				luaL_checkstring(L, 2),
				luaL_optstring(L, 3, "."),
				luaL_optstring(L, 4, LUA_DIRSEP));
  if (f != NULL) {
    return 1;
  } else {  /* error message is on top of the stack */
    lua_pushnil(L);
    lua_insert(L, -2);
    return 2;  /* return nil + error message */
  }
}